

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O0

int tx_elements_input_issuance_init
              (wally_tx_input *input,uchar *nonce,size_t nonce_len,uchar *entropy,size_t entropy_len
              ,uchar *issuance_amount,size_t issuance_amount_len,uchar *inflation_keys,
              size_t inflation_keys_len,uchar *issuance_amount_rangeproof,
              size_t issuance_amount_rangeproof_len,uchar *inflation_keys_rangeproof,
              size_t inflation_keys_rangeproof_len,_Bool is_elements)

{
  _Bool _Var1;
  uchar *local_58;
  uchar *new_inflation_keys;
  uchar *new_issuance_amount;
  int ret;
  _Bool is_elements_local;
  uchar *issuance_amount_local;
  size_t entropy_len_local;
  uchar *entropy_local;
  size_t nonce_len_local;
  uchar *nonce_local;
  wally_tx_input *input_local;
  
  new_issuance_amount._7_1_ = is_elements;
  new_inflation_keys = (uchar *)0x0;
  local_58 = (uchar *)0x0;
  if (((((input == (wally_tx_input *)0x0) || ((nonce != (uchar *)0x0) != (nonce_len == 0x20))) ||
       ((entropy != (uchar *)0x0) != (entropy_len == 0x20))) ||
      (((issuance_amount != (uchar *)0x0) != (issuance_amount_len != 0) ||
       ((inflation_keys != (uchar *)0x0) != (inflation_keys_len != 0))))) ||
     (((issuance_amount_rangeproof != (uchar *)0x0) != (issuance_amount_rangeproof_len != 0) ||
      ((inflation_keys_rangeproof != (uchar *)0x0) != (inflation_keys_rangeproof_len != 0))))) {
    input_local._4_4_ = -2;
  }
  else {
    _ret = issuance_amount;
    issuance_amount_local = (uchar *)entropy_len;
    entropy_len_local = (size_t)entropy;
    entropy_local = (uchar *)nonce_len;
    nonce_len_local = (size_t)nonce;
    nonce_local = input->txhash;
    _Var1 = clone_bytes(&new_inflation_keys,issuance_amount,issuance_amount_len);
    if ((_Var1) && (_Var1 = clone_bytes(&local_58,inflation_keys,inflation_keys_len), _Var1)) {
      new_issuance_amount._0_4_ =
           tx_elements_input_issuance_proof_init
                     ((wally_tx_input *)nonce_local,issuance_amount_rangeproof,
                      issuance_amount_rangeproof_len,inflation_keys_rangeproof,
                      inflation_keys_rangeproof_len);
    }
    else {
      new_issuance_amount._0_4_ = -3;
    }
    if ((int)new_issuance_amount == 0) {
      if (nonce_len_local == 0) {
        wally_clear(nonce_local + 0x41,0x20);
      }
      else {
        *(undefined8 *)(nonce_local + 0x41) = *(undefined8 *)nonce_len_local;
        *(undefined8 *)(nonce_local + 0x49) = *(undefined8 *)(nonce_len_local + 8);
        *(undefined8 *)(nonce_local + 0x51) = *(undefined8 *)(nonce_len_local + 0x10);
        *(undefined8 *)(nonce_local + 0x59) = *(undefined8 *)(nonce_len_local + 0x18);
      }
      if (entropy_len_local == 0) {
        wally_clear(nonce_local + 0x61,0x20);
      }
      else {
        *(undefined8 *)(nonce_local + 0x61) = *(undefined8 *)entropy_len_local;
        *(undefined8 *)(nonce_local + 0x69) = *(undefined8 *)(entropy_len_local + 8);
        *(undefined8 *)(nonce_local + 0x71) = *(undefined8 *)(entropy_len_local + 0x10);
        *(undefined8 *)(nonce_local + 0x79) = *(undefined8 *)(entropy_len_local + 0x18);
      }
      *(uchar **)(nonce_local + 0x88) = new_inflation_keys;
      *(size_t *)(nonce_local + 0x90) = issuance_amount_len;
      *(uchar **)(nonce_local + 0x98) = local_58;
      *(size_t *)(nonce_local + 0xa0) = inflation_keys_len;
      if (((new_issuance_amount._7_1_ & 1) != 0) &&
         ((nonce_local[0x40] = nonce_local[0x40] | 1, nonce_len_local != 0 ||
          (entropy_len_local != 0)))) {
        nonce_local[0x40] = nonce_local[0x40] | 2;
      }
      input_local._4_4_ = 0;
    }
    else {
      clear_and_free(new_inflation_keys,issuance_amount_len);
      clear_and_free(local_58,inflation_keys_len);
      input_local._4_4_ = (int)new_issuance_amount;
    }
  }
  return input_local._4_4_;
}

Assistant:

static int tx_elements_input_issuance_init(
    struct wally_tx_input *input,
    const unsigned char *nonce,
    size_t nonce_len,
    const unsigned char *entropy,
    size_t entropy_len,
    const unsigned char *issuance_amount,
    size_t issuance_amount_len,
    const unsigned char *inflation_keys,
    size_t inflation_keys_len,
    const unsigned char *issuance_amount_rangeproof,
    size_t issuance_amount_rangeproof_len,
    const unsigned char *inflation_keys_rangeproof,
    size_t inflation_keys_rangeproof_len,
    bool is_elements)
{
#ifdef BUILD_ELEMENTS
    int ret;
    unsigned char *new_issuance_amount = NULL, *new_inflation_keys = NULL;
#endif

    if (!input ||
        BYTES_INVALID_N(nonce, nonce_len, WALLY_TX_ASSET_TAG_LEN) ||
        BYTES_INVALID_N(entropy, entropy_len, WALLY_TX_ASSET_TAG_LEN) ||
        BYTES_INVALID(issuance_amount, issuance_amount_len) ||
        BYTES_INVALID(inflation_keys, inflation_keys_len) ||
        BYTES_INVALID(issuance_amount_rangeproof, issuance_amount_rangeproof_len) ||
        BYTES_INVALID(inflation_keys_rangeproof, inflation_keys_rangeproof_len))
        return WALLY_EINVAL;

#ifdef BUILD_ELEMENTS
    if (!clone_bytes(&new_issuance_amount, issuance_amount, issuance_amount_len) ||
        !clone_bytes(&new_inflation_keys, inflation_keys, inflation_keys_len))
        ret = WALLY_ENOMEM;
    else
        ret = tx_elements_input_issuance_proof_init(input,
                                                    issuance_amount_rangeproof,
                                                    issuance_amount_rangeproof_len,
                                                    inflation_keys_rangeproof,
                                                    inflation_keys_rangeproof_len);

    if (ret != WALLY_OK) {
        clear_and_free(new_issuance_amount, issuance_amount_len);
        clear_and_free(new_inflation_keys, inflation_keys_len);
        return ret;
    }

    TX_COPY_ELSE_CLEAR(input->blinding_nonce, nonce, sizeof(input->blinding_nonce));
    TX_COPY_ELSE_CLEAR(input->entropy, entropy, sizeof(input->entropy));
    input->issuance_amount = new_issuance_amount;
    input->issuance_amount_len = issuance_amount_len;
    input->inflation_keys = new_inflation_keys;
    input->inflation_keys_len = inflation_keys_len;
#endif

    if (is_elements) {
        input->features |= WALLY_TX_IS_ELEMENTS;
        if (nonce || entropy)
            input->features |= WALLY_TX_IS_ISSUANCE;
    }

    return WALLY_OK;
}